

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dependency.cpp
# Opt level: O1

string * __thiscall
Dependency::getInstallPath_abi_cxx11_(string *__return_storage_ptr__,Dependency *this)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  undefined1 *local_38 [2];
  undefined1 local_28 [16];
  
  Settings::destFolder_abi_cxx11_();
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_38,(ulong)(this->new_name)._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_38[0] != local_28) {
    operator_delete(local_38[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Dependency::getInstallPath()
{
    return Settings::destFolder() + new_name;
}